

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::DoParse
          (Parser *this,char *source,char **include_paths,char *source_filename,
          char *include_filename)

{
  bool bVar1;
  mapped_type *this_00;
  mapped_type *pmVar2;
  _Rb_tree_const_iterator<flatbuffers::IncludedFile> buf;
  flatbuffers *this_01;
  char *source_00;
  char **include_paths_00;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  mapped_type *pmVar6;
  int t;
  uint64_t in_R9;
  undefined1 auVar7 [16];
  pair<std::_Rb_tree_const_iterator<flatbuffers::IncludedFile>,_bool> pVar8;
  char *local_440;
  allocator<char> local_419;
  string local_418 [34];
  byte local_3f6;
  byte local_3f5;
  byte local_3f4;
  byte local_3f3;
  byte local_3f2;
  byte local_3f1;
  undefined1 local_3f0 [8];
  string name_1;
  string local_3c8 [36];
  byte local_3a4;
  byte local_3a3;
  byte local_3a2;
  byte local_3a1;
  string local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  byte local_33c;
  byte local_33b;
  byte local_33a;
  allocator<char> local_339;
  string local_338 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  byte local_2f2;
  byte local_2f1;
  undefined1 local_2f0 [8];
  string root_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  _Self local_2a8;
  uint64_t local_2a0;
  _Self local_298;
  byte local_289;
  string local_288 [7];
  bool file_loaded;
  string contents;
  allocator<char> local_251;
  key_type local_250;
  undefined1 local_230 [8];
  IncludedFile included_file;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  long *local_188;
  char **paths;
  allocator<char> local_159;
  string local_158;
  undefined1 local_138 [8];
  string source_file_directory;
  string filepath;
  undefined1 local_f0 [8];
  string name;
  allocator<char> local_a9;
  key_type local_a8;
  set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>
  local_88;
  _Self local_50;
  _Self local_48;
  key_type local_40;
  uint64_t source_hash;
  char *include_filename_local;
  char *source_filename_local;
  char **include_paths_local;
  char *source_local;
  Parser *this_local;
  CheckedError *ce;
  
  local_40 = 0;
  include_filename_local = include_filename;
  source_filename_local = source_filename;
  include_paths_local = include_paths;
  source_local = source;
  this_local = this;
  if (include_filename != (char *)0x0) {
    source_hash = in_R9;
    bVar1 = FileExists(include_filename);
    if (bVar1) {
      local_40 = anon_unknown_0::HashFile(include_filename_local,(char *)include_paths_local);
    }
    else {
      local_40 = anon_unknown_0::HashFile(include_filename_local,(char *)0x0);
    }
    local_48._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(source + 0x340),&local_40);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(source + 0x340));
    bVar1 = std::operator==(&local_48,&local_50);
    if (!bVar1) {
      anon_unknown_0::NoError();
      goto LAB_00132115;
    }
    if (source_hash == 0) {
      local_440 = "";
    }
    else {
      local_440 = (char *)source_hash;
    }
    this_00 = std::
              map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)(source + 0x340),&local_40);
    std::__cxx11::string::operator=((string *)this_00,local_440);
    local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_88._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_88._M_t._M_impl._0_8_ = 0;
    local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_88._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::
    set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>
    ::set(&local_88);
    pcVar4 = include_filename_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,pcVar4,&local_a9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
                           *)(source + 0x370),&local_a8);
    std::
    set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>
    ::operator=(pmVar2,&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    std::
    set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>
    ::~set(&local_88);
  }
  if (source_filename_local == (char *)0x0) {
    source_filename_local = (char *)DoParse::current_directory;
  }
  std::
  vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
  ::clear((vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
           *)(source + 0x730));
  FlatBufferBuilderImpl<false>::Clear((FlatBufferBuilderImpl<false> *)(source + 0x1c8));
  *(undefined8 *)(source + 0x198) = *(undefined8 *)(source + 0x1a0);
  buf._M_node = (_Base_ptr)include_filename_local;
  StartParseFile(this,source,(char *)include_paths_local);
  bVar1 = CheckedError::Check((CheckedError *)this);
  if (!bVar1) {
    CheckedError::~CheckedError((CheckedError *)this);
    do {
      while( true ) {
        while (((source[0x3f9] & 1U) != 0 &&
               (((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)(source + 0x28),"option"), bVar1 ||
                 (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)(source + 0x28),"syntax"), bVar1)) ||
                (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(source + 0x28),"package"), bVar1))))) {
          ParseProtoDecl(this);
          bVar1 = CheckedError::Check((CheckedError *)this);
          if (bVar1) goto LAB_00132115;
          CheckedError::~CheckedError((CheckedError *)this);
        }
        bVar1 = IsIdent((Parser *)source,"native_include");
        t = (int)source;
        if (!bVar1) break;
        Next(this);
        bVar1 = CheckedError::Check((CheckedError *)this);
        if (bVar1) goto LAB_00132115;
        CheckedError::~CheckedError((CheckedError *)this);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   (source + 0x3a0),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (source + 0x28));
        Expect(this,t);
        bVar1 = CheckedError::Check((CheckedError *)this);
        if (bVar1) goto LAB_00132115;
        CheckedError::~CheckedError((CheckedError *)this);
        Expect(this,t);
        bVar1 = CheckedError::Check((CheckedError *)this);
        if (bVar1) goto LAB_00132115;
        CheckedError::~CheckedError((CheckedError *)this);
      }
      bVar1 = IsIdent((Parser *)source,"include");
      if ((!bVar1) &&
         (((source[0x3f9] & 1U) == 0 || (bVar1 = IsIdent((Parser *)source,"import"), !bVar1))))
      goto LAB_00130c9a;
      name.field_2._M_local_buf[0xf] = '\0';
      Next(this);
      bVar1 = CheckedError::Check((CheckedError *)this);
      if (bVar1) {
        name.field_2._M_local_buf[0xf] = '\x01';
      }
      if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (bVar1) break;
      if (((source[0x3f9] & 1U) != 0) &&
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(source + 0x28),"public"), bVar1)) {
        name.field_2._M_local_buf[0xe] = '\0';
        Next(this);
        bVar1 = CheckedError::Check((CheckedError *)this);
        if (bVar1) {
          name.field_2._M_local_buf[0xe] = '\x01';
        }
        if ((name.field_2._M_local_buf[0xe] & 1U) == 0) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
        if (bVar1) break;
      }
      auVar7 = std::__cxx11::string::c_str();
      PosixPath_abi_cxx11_((string *)local_f0,auVar7._0_8_,auVar7._8_8_);
      Expect(this,t);
      bVar1 = CheckedError::Check((CheckedError *)this);
      if (!bVar1) {
        CheckedError::~CheckedError((CheckedError *)this);
        std::__cxx11::string::string((string *)(source_file_directory.field_2._M_local_buf + 8));
        pcVar4 = include_filename_local;
        if (include_filename_local != (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,pcVar4,&local_159)
          ;
          StripFileName((string *)local_138,&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          std::allocator<char>::~allocator(&local_159);
          ConCatPathFileName((string *)&paths,(string *)local_138,(string *)local_f0);
          std::__cxx11::string::operator=
                    ((string *)(source_file_directory.field_2._M_local_buf + 8),(string *)&paths);
          std::__cxx11::string::~string((string *)&paths);
          std::__cxx11::string::~string((string *)local_138);
        }
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          pcVar4 = (char *)std::__cxx11::string::c_str();
          bVar1 = FileExists(pcVar4);
          if (!bVar1) goto LAB_001304df;
        }
        else {
LAB_001304df:
          local_188 = (long *)source_filename_local;
          while( true ) {
            bVar1 = false;
            if (local_188 != (long *)0x0) {
              bVar1 = *local_188 != 0;
            }
            if (!bVar1) break;
            pcVar4 = (char *)*local_188;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1c8,pcVar4,&local_1c9);
            ConCatPathFileName(&local_1a8,&local_1c8,(string *)local_f0);
            std::__cxx11::string::operator=
                      ((string *)(source_file_directory.field_2._M_local_buf + 8),
                       (string *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::allocator<char>::~allocator(&local_1c9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            bVar1 = FileExists(pcVar4);
            if (bVar1) break;
            local_188 = local_188 + 1;
          }
        }
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          if (include_filename_local != (char *)0x0) {
            IncludedFile::IncludedFile((IncludedFile *)local_230);
            std::__cxx11::string::operator=
                      ((string *)(included_file.schema_name.field_2._M_local_buf + 8),
                       (string *)(source_file_directory.field_2._M_local_buf + 8));
            std::__cxx11::string::operator=((string *)local_230,(string *)local_f0);
            pcVar4 = include_filename_local;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_250,pcVar4,&local_251);
            pmVar2 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
                                   *)(source + 0x370),&local_250);
            pVar8 = std::
                    set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>
                    ::insert(pmVar2,(value_type *)local_230);
            buf = pVar8.first._M_node;
            contents.field_2._8_8_ = buf._M_node;
            std::__cxx11::string::~string((string *)&local_250);
            std::allocator<char>::~allocator(&local_251);
            IncludedFile::~IncludedFile((IncludedFile *)local_230);
          }
          std::__cxx11::string::string(local_288);
          this_01 = (flatbuffers *)std::__cxx11::string::c_str();
          local_289 = LoadFile(this_01,(char *)0x1,SUB81(local_288,0),(string *)buf._M_node);
          buf._M_node = (_Base_ptr)CONCAT71((int7)((ulong)buf._M_node >> 8),local_289);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          source_00 = (char *)std::__cxx11::string::c_str();
          local_2a0 = anon_unknown_0::HashFile(pcVar4,source_00);
          local_298._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(source + 0x340),&local_2a0);
          local_2a8._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(source + 0x340));
          bVar1 = std::operator==(&local_298,&local_2a8);
          if (bVar1) {
            if ((local_289 & 1) == 0) {
              std::operator+(&local_2c8,"unable to load include file: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_f0);
              Error(this,(string *)source);
              std::__cxx11::string::~string((string *)&local_2c8);
              bVar1 = true;
            }
            else {
              root_type.field_2._M_local_buf[0xf] = '\0';
              include_paths_00 = (char **)std::__cxx11::string::c_str();
              buf._M_node = (_Base_ptr)source_filename_local;
              pcVar4 = (char *)std::__cxx11::string::c_str();
              std::__cxx11::string::c_str();
              DoParse(this,source,include_paths_00,(char *)buf._M_node,pcVar4);
              bVar1 = CheckedError::Check((CheckedError *)this);
              if (bVar1) {
                root_type.field_2._M_local_buf[0xf] = '\x01';
              }
              if ((root_type.field_2._M_local_buf[0xf] & 1U) == 0) {
                CheckedError::~CheckedError((CheckedError *)this);
              }
              if (!bVar1) {
                if ((source[0x3fb] & 1U) == 0) {
                  MarkGenerated((Parser *)source);
                }
                source[0x2f8] = '\0';
                source[0x2f9] = '\0';
                source[0x2fa] = '\0';
                source[0x2fb] = '\0';
                source[0x2fc] = '\0';
                source[0x2fd] = '\0';
                source[0x2fe] = '\0';
                source[0x2ff] = '\0';
                std::__cxx11::string::clear();
                std::__cxx11::string::clear();
                std::
                map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::erase((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(source + 0x340),&local_40);
                buf._M_node = (_Base_ptr)source_filename_local;
                DoParse(this,source,include_paths_local,source_filename_local,include_filename_local
                       );
                bVar1 = true;
              }
            }
          }
          else {
            root_type.field_2._M_local_buf[0xe] = '\0';
            Expect(this,t);
            bVar1 = CheckedError::Check((CheckedError *)this);
            if (bVar1) {
              root_type.field_2._M_local_buf[0xe] = '\x01';
            }
            if ((root_type.field_2._M_local_buf[0xe] & 1U) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (!bVar1) {
              bVar1 = false;
            }
          }
          std::__cxx11::string::~string(local_288);
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&included_file.filename.field_2 + 8),
                         "unable to locate include file: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0);
          Error(this,(string *)source);
          std::__cxx11::string::~string((string *)(included_file.filename.field_2._M_local_buf + 8))
          ;
          bVar1 = true;
        }
        std::__cxx11::string::~string((string *)(source_file_directory.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::~string((string *)local_f0);
    } while (bVar1 == false);
  }
  goto LAB_00132115;
  while( true ) {
    root_type.field_2._M_local_buf[0xc] = '\0';
    ParseNamespace(this);
    bVar1 = CheckedError::Check((CheckedError *)this);
    if (bVar1) {
      root_type.field_2._M_local_buf[0xc] = '\x01';
    }
    if ((root_type.field_2._M_local_buf[0xc] & 1U) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (bVar1) break;
LAB_00130c9a:
    if (*(int *)(source + 0x1c) == 0x100) {
      local_3f6 = 0;
      Expect(this,t);
      bVar1 = CheckedError::Check((CheckedError *)this);
      if (bVar1) {
        local_3f6 = 1;
      }
      if ((local_3f6 & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (!bVar1) {
        if (((source[0x619] & 1U) == 0) || ((source[0x6f9] & 1U) == 0)) {
          anon_unknown_0::NoError();
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_418,"treating warnings as errors, failed due to above warnings",
                     &local_419);
          Error(this,(string *)source);
          std::__cxx11::string::~string(local_418);
          std::allocator<char>::~allocator(&local_419);
        }
      }
      break;
    }
    if ((source[0x3f9] & 1U) != 0) {
      root_type.field_2._M_local_buf[0xd] = '\0';
      ParseProtoDecl(this);
      bVar1 = CheckedError::Check((CheckedError *)this);
      if (bVar1) {
        root_type.field_2._M_local_buf[0xd] = '\x01';
      }
      if ((root_type.field_2._M_local_buf[0xd] & 1U) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (bVar1) break;
      goto LAB_00130c9a;
    }
    bVar1 = IsIdent((Parser *)source,"namespace");
    if (!bVar1) {
      if (*(int *)(source + 0x1c) == 0x7b) {
        anon_unknown_0::NoError();
        break;
      }
      bVar1 = IsIdent((Parser *)source,"enum");
      if (!bVar1) {
        bVar1 = IsIdent((Parser *)source,"union");
        if (bVar1) {
          root_type.field_2._M_local_buf[10] = '\0';
          ParseEnum(this,SUB81(source,0),(EnumDef **)0x1,(char *)0x0);
          bVar1 = CheckedError::Check((CheckedError *)this);
          if (bVar1) {
            root_type.field_2._M_local_buf[10] = '\x01';
          }
          if ((root_type.field_2._M_local_buf[10] & 1U) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if (bVar1) break;
          goto LAB_00130c9a;
        }
        bVar1 = IsIdent((Parser *)source,"root_type");
        if (bVar1) {
          root_type.field_2._M_local_buf[9] = '\0';
          Next(this);
          bVar1 = CheckedError::Check((CheckedError *)this);
          if (bVar1) {
            root_type.field_2._M_local_buf[9] = '\x01';
          }
          if ((root_type.field_2._M_local_buf[9] & 1U) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if (bVar1) break;
          std::__cxx11::string::string((string *)local_2f0,(string *)(source + 0x28));
          local_2f1 = 0;
          Expect(this,t);
          bVar1 = CheckedError::Check((CheckedError *)this);
          if (bVar1) {
            local_2f1 = 1;
          }
          if ((local_2f1 & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if (!bVar1) {
            local_2f2 = 0;
            ParseNamespacing(this,(string *)source,(string *)local_2f0);
            bVar1 = CheckedError::Check((CheckedError *)this);
            if (bVar1) {
              local_2f2 = 1;
            }
            if ((local_2f2 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (!bVar1) {
              uVar3 = std::__cxx11::string::empty();
              if ((uVar3 & 1) == 0) {
LAB_001313b3:
                local_33a = 0;
                Expect(this,t);
                bVar1 = CheckedError::Check((CheckedError *)this);
                if (bVar1) {
                  local_33a = 1;
                }
                if ((local_33a & 1) == 0) {
                  CheckedError::~CheckedError((CheckedError *)this);
                }
                if (!bVar1) {
                  bVar1 = false;
                }
              }
              else {
                pcVar4 = (char *)std::__cxx11::string::c_str();
                bVar1 = SetRootType((Parser *)source,pcVar4);
                if (bVar1) {
                  if ((*(byte *)(*(long *)(source + 0x2f8) + 0x110) & 1) == 0) goto LAB_001313b3;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_338,"root type must be a table",&local_339);
                  Error(this,(string *)source);
                  std::__cxx11::string::~string(local_338);
                  std::allocator<char>::~allocator(&local_339);
                  bVar1 = true;
                }
                else {
                  std::operator+(&local_318,"unknown root type: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2f0);
                  Error(this,(string *)source);
                  std::__cxx11::string::~string((string *)&local_318);
                  bVar1 = true;
                }
              }
            }
          }
          std::__cxx11::string::~string((string *)local_2f0);
        }
        else {
          bVar1 = IsIdent((Parser *)source,"file_identifier");
          if (bVar1) {
            local_33b = 0;
            Next(this);
            bVar1 = CheckedError::Check((CheckedError *)this);
            if (bVar1) {
              local_33b = 1;
            }
            if ((local_33b & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (bVar1) break;
            std::__cxx11::string::operator=((string *)(source + 0x300),(string *)(source + 0x28));
            local_33c = 0;
            Expect(this,t);
            bVar1 = CheckedError::Check((CheckedError *)this);
            if (bVar1) {
              local_33c = 1;
            }
            if ((local_33c & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (bVar1) break;
            lVar5 = std::__cxx11::string::length();
            if (lVar5 != 4) {
              NumToString<unsigned_long>(&local_3a0,4);
              std::operator+(&local_380,"file_identifier must be exactly ",&local_3a0);
              std::operator+(&local_360,&local_380," characters");
              Error(this,(string *)source);
              std::__cxx11::string::~string((string *)&local_360);
              std::__cxx11::string::~string((string *)&local_380);
              std::__cxx11::string::~string((string *)&local_3a0);
              break;
            }
            local_3a1 = 0;
            Expect(this,t);
            bVar1 = CheckedError::Check((CheckedError *)this);
            if (bVar1) {
              local_3a1 = 1;
            }
            if ((local_3a1 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (bVar1) break;
            goto LAB_00130c9a;
          }
          bVar1 = IsIdent((Parser *)source,"file_extension");
          if (bVar1) {
            local_3a2 = 0;
            Next(this);
            bVar1 = CheckedError::Check((CheckedError *)this);
            if (bVar1) {
              local_3a2 = 1;
            }
            if ((local_3a2 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (bVar1) break;
            std::__cxx11::string::operator=((string *)(source + 800),(string *)(source + 0x28));
            local_3a3 = 0;
            Expect(this,t);
            bVar1 = CheckedError::Check((CheckedError *)this);
            if (bVar1) {
              local_3a3 = 1;
            }
            if ((local_3a3 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (bVar1) break;
            local_3a4 = 0;
            Expect(this,t);
            bVar1 = CheckedError::Check((CheckedError *)this);
            if (bVar1) {
              local_3a4 = 1;
            }
            if ((local_3a4 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (bVar1) break;
            goto LAB_00130c9a;
          }
          bVar1 = IsIdent((Parser *)source,"include");
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_3c8,"includes must come before declarations",
                       (allocator<char> *)(name_1.field_2._M_local_buf + 0xf));
            Error(this,(string *)source);
            std::__cxx11::string::~string(local_3c8);
            std::allocator<char>::~allocator((allocator<char> *)(name_1.field_2._M_local_buf + 0xf))
            ;
            break;
          }
          bVar1 = IsIdent((Parser *)source,"attribute");
          if (!bVar1) {
            bVar1 = IsIdent((Parser *)source,"rpc_service");
            if (bVar1) {
              local_3f4 = 0;
              ParseService(this,source);
              bVar1 = CheckedError::Check((CheckedError *)this);
              if (bVar1) {
                local_3f4 = 1;
              }
              if ((local_3f4 & 1) == 0) {
                CheckedError::~CheckedError((CheckedError *)this);
              }
              if (bVar1) break;
            }
            else {
              local_3f5 = 0;
              ParseDecl(this,source);
              bVar1 = CheckedError::Check((CheckedError *)this);
              if (bVar1) {
                local_3f5 = 1;
              }
              if ((local_3f5 & 1) == 0) {
                CheckedError::~CheckedError((CheckedError *)this);
              }
              if (bVar1) break;
            }
            goto LAB_00130c9a;
          }
          name_1.field_2._M_local_buf[0xe] = '\0';
          Next(this);
          bVar1 = CheckedError::Check((CheckedError *)this);
          if (bVar1) {
            name_1.field_2._M_local_buf[0xe] = '\x01';
          }
          if ((name_1.field_2._M_local_buf[0xe] & 1U) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if (bVar1) break;
          std::__cxx11::string::string((string *)local_3f0,(string *)(source + 0x28));
          bVar1 = Is((Parser *)source,0x104);
          if (bVar1) {
            local_3f1 = 0;
            Next(this);
            bVar1 = CheckedError::Check((CheckedError *)this);
            if (bVar1) {
              local_3f1 = 1;
            }
            if ((local_3f1 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
          }
          else {
            local_3f2 = 0;
            Expect(this,t);
            bVar1 = CheckedError::Check((CheckedError *)this);
            if (bVar1) {
              local_3f2 = 1;
            }
            if ((local_3f2 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
          }
          if (!bVar1) {
            local_3f3 = 0;
            Expect(this,t);
            bVar1 = CheckedError::Check((CheckedError *)this);
            if (bVar1) {
              local_3f3 = 1;
            }
            if ((local_3f3 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (!bVar1) {
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                                     *)(source + 0x3b8),(key_type *)local_3f0);
              *pmVar6 = false;
              bVar1 = false;
            }
          }
          std::__cxx11::string::~string((string *)local_3f0);
        }
        if (bVar1 != false) break;
        goto LAB_00130c9a;
      }
      root_type.field_2._M_local_buf[0xb] = '\0';
      ParseEnum(this,SUB81(source,0),(EnumDef **)0x0,(char *)0x0);
      bVar1 = CheckedError::Check((CheckedError *)this);
      if (bVar1) {
        root_type.field_2._M_local_buf[0xb] = '\x01';
      }
      if ((root_type.field_2._M_local_buf[0xb] & 1U) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (bVar1) break;
      goto LAB_00130c9a;
    }
  }
LAB_00132115:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::DoParse(const char *source, const char **include_paths,
                             const char *source_filename,
                             const char *include_filename) {
  uint64_t source_hash = 0;
  if (source_filename) {
    // If the file is in-memory, don't include its contents in the hash as we
    // won't be able to load them later.
    if (FileExists(source_filename))
      source_hash = HashFile(source_filename, source);
    else
      source_hash = HashFile(source_filename, nullptr);

    if (included_files_.find(source_hash) == included_files_.end()) {
      included_files_[source_hash] = include_filename ? include_filename : "";
      files_included_per_file_[source_filename] = std::set<IncludedFile>();
    } else {
      return NoError();
    }
  }
  if (!include_paths) {
    static const char *current_directory[] = { "", nullptr };
    include_paths = current_directory;
  }
  field_stack_.clear();
  builder_.Clear();
  // Start with a blank namespace just in case this file doesn't have one.
  current_namespace_ = empty_namespace_;

  ECHECK(StartParseFile(source, source_filename));

  // Includes must come before type declarations:
  for (;;) {
    // Parse pre-include proto statements if any:
    if (opts.proto_mode && (attribute_ == "option" || attribute_ == "syntax" ||
                            attribute_ == "package")) {
      ECHECK(ParseProtoDecl());
    } else if (IsIdent("native_include")) {
      NEXT();
      native_included_files_.emplace_back(attribute_);
      EXPECT(kTokenStringConstant);
      EXPECT(';');
    } else if (IsIdent("include") || (opts.proto_mode && IsIdent("import"))) {
      NEXT();
      if (opts.proto_mode && attribute_ == "public") NEXT();
      auto name = flatbuffers::PosixPath(attribute_.c_str());
      EXPECT(kTokenStringConstant);
      // Look for the file relative to the directory of the current file.
      std::string filepath;
      if (source_filename) {
        auto source_file_directory =
            flatbuffers::StripFileName(source_filename);
        filepath = flatbuffers::ConCatPathFileName(source_file_directory, name);
      }
      if (filepath.empty() || !FileExists(filepath.c_str())) {
        // Look for the file in include_paths.
        for (auto paths = include_paths; paths && *paths; paths++) {
          filepath = flatbuffers::ConCatPathFileName(*paths, name);
          if (FileExists(filepath.c_str())) break;
        }
      }
      if (filepath.empty())
        return Error("unable to locate include file: " + name);
      if (source_filename) {
        IncludedFile included_file;
        included_file.filename = filepath;
        included_file.schema_name = name;
        files_included_per_file_[source_filename].insert(included_file);
      }

      std::string contents;
      bool file_loaded = LoadFile(filepath.c_str(), true, &contents);
      if (included_files_.find(HashFile(filepath.c_str(), contents.c_str())) ==
          included_files_.end()) {
        // We found an include file that we have not parsed yet.
        // Parse it.
        if (!file_loaded) return Error("unable to load include file: " + name);
        ECHECK(DoParse(contents.c_str(), include_paths, filepath.c_str(),
                       name.c_str()));
        // We generally do not want to output code for any included files:
        if (!opts.generate_all) MarkGenerated();
        // Reset these just in case the included file had them, and the
        // parent doesn't.
        root_struct_def_ = nullptr;
        file_identifier_.clear();
        file_extension_.clear();
        // This is the easiest way to continue this file after an include:
        // instead of saving and restoring all the state, we simply start the
        // file anew. This will cause it to encounter the same include
        // statement again, but this time it will skip it, because it was
        // entered into included_files_.
        // This is recursive, but only go as deep as the number of include
        // statements.
        included_files_.erase(source_hash);
        return DoParse(source, include_paths, source_filename,
                       include_filename);
      }
      EXPECT(';');
    } else {
      break;
    }
  }
  // Now parse all other kinds of declarations:
  while (token_ != kTokenEof) {
    if (opts.proto_mode) {
      ECHECK(ParseProtoDecl());
    } else if (IsIdent("namespace")) {
      ECHECK(ParseNamespace());
    } else if (token_ == '{') {
      return NoError();
    } else if (IsIdent("enum")) {
      ECHECK(ParseEnum(false, nullptr, source_filename));
    } else if (IsIdent("union")) {
      ECHECK(ParseEnum(true, nullptr, source_filename));
    } else if (IsIdent("root_type")) {
      NEXT();
      auto root_type = attribute_;
      EXPECT(kTokenIdentifier);
      ECHECK(ParseNamespacing(&root_type, nullptr));
      if (opts.root_type.empty()) {
        if (!SetRootType(root_type.c_str()))
          return Error("unknown root type: " + root_type);
        if (root_struct_def_->fixed) return Error("root type must be a table");
      }
      EXPECT(';');
    } else if (IsIdent("file_identifier")) {
      NEXT();
      file_identifier_ = attribute_;
      EXPECT(kTokenStringConstant);
      if (file_identifier_.length() != flatbuffers::kFileIdentifierLength)
        return Error("file_identifier must be exactly " +
                     NumToString(flatbuffers::kFileIdentifierLength) +
                     " characters");
      EXPECT(';');
    } else if (IsIdent("file_extension")) {
      NEXT();
      file_extension_ = attribute_;
      EXPECT(kTokenStringConstant);
      EXPECT(';');
    } else if (IsIdent("include")) {
      return Error("includes must come before declarations");
    } else if (IsIdent("attribute")) {
      NEXT();
      auto name = attribute_;
      if (Is(kTokenIdentifier)) {
        NEXT();
      } else {
        EXPECT(kTokenStringConstant);
      }
      EXPECT(';');
      known_attributes_[name] = false;
    } else if (IsIdent("rpc_service")) {
      ECHECK(ParseService(source_filename));
    } else {
      ECHECK(ParseDecl(source_filename));
    }
  }
  EXPECT(kTokenEof);
  if (opts.warnings_as_errors && has_warning_) {
    return Error("treating warnings as errors, failed due to above warnings");
  }
  return NoError();
}